

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

handle pybind11::detail::
       list_caster<std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int>::
       cast<std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *src,
                 return_value_policy policy,handle parent)

{
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  size_type size;
  forwarded_type<const_std::vector<unsigned_int>_&,_const_unsigned_int_&> puVar4;
  PyObject **ppPVar5;
  handle local_90;
  int local_84;
  PyObject *local_80;
  PyObject *local_68;
  handle local_60;
  object value_;
  uint *value;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  size_t index;
  list l;
  return_value_policy policy_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *src_local;
  handle parent_local;
  
  l.super_object.super_handle.m_ptr._7_1_ = policy;
  size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(src);
  list::list((list *)&index,size);
  __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(src);
  value = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(src);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&value);
    if (!bVar2) break;
    value_.super_handle.m_ptr =
         (handle)__gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end0);
    puVar4 = forward_like<std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int_const&>
                       ((uint *)value_.super_handle.m_ptr);
    local_80 = parent.m_ptr;
    local_68 = (PyObject *)
               type_caster<unsigned_int,_void>::cast<unsigned_int>
                         (*puVar4,l.super_object.super_handle.m_ptr._7_1_,parent);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,(handle)local_68);
    bVar2 = handle::operator_cast_to_bool(&local_60);
    if (bVar2) {
      local_90 = object::release((object *)&local_60);
      ppPVar5 = handle::ptr(&local_90);
      pPVar1 = *ppPVar5;
      ppPVar5 = handle::ptr((handle *)&index);
      iVar3 = PyType_HasFeature((*ppPVar5)->ob_type,0x2000000);
      if (iVar3 == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<unsigned int>, unsigned int>::cast(T &&, return_value_policy, handle) [Type = std::vector<unsigned int>, Value = unsigned int, T = const std::vector<unsigned int> &]"
                     );
      }
      ppPVar5 = handle::ptr((handle *)&index);
      (&(((*ppPVar5)[1].ob_type)->ob_base).ob_base.ob_refcnt)[(long)__range3] = (Py_ssize_t)pPVar1;
      local_84 = 0;
      __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(__range3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    else {
      memset(&parent_local,0,8);
      handle::handle(&parent_local);
      local_84 = 1;
    }
    object::~object((object *)&local_60);
    if (local_84 != 0) goto LAB_00156888;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  parent_local = object::release((object *)&index);
  local_84 = 1;
LAB_00156888:
  list::~list((list *)&index);
  return (handle)parent_local.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }